

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::bindBuffer(ReferenceContext *this,deUint32 target,deUint32 buffer)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  DataBuffer *buffer_00;
  _Base_ptr p_Var4;
  deUint32 name;
  pair<unsigned_int,_sglr::rc::DataBuffer_*> local_30;
  
  bVar2 = isValidBufferTarget(target);
  if (!bVar2) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (buffer == 0) {
    buffer_00 = (DataBuffer *)0x0;
  }
  else {
    p_Var4 = (this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      p_Var1 = &(this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = &p_Var1->_M_header;
      do {
        bVar2 = p_Var4[1]._M_color < buffer;
        if (!bVar2) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar2];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var3[1]._M_color <= buffer)) &&
         (buffer_00 = (DataBuffer *)p_Var3[1]._M_parent, buffer_00 != (DataBuffer *)0x0))
      goto LAB_00989a6a;
    }
    buffer_00 = (DataBuffer *)operator_new(0x28);
    (buffer_00->super_NamedObject).m_name = buffer;
    (buffer_00->super_NamedObject).m_refCount = 1;
    (buffer_00->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__DataBuffer_00d2ee48;
    (buffer_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (buffer_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (buffer_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((this->m_buffers).m_lastName < buffer) {
      (this->m_buffers).m_lastName = buffer;
    }
    local_30.first = buffer;
    local_30.second = buffer_00;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::DataBuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>>
    ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::DataBuffer*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::DataBuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::DataBuffer*>>>
                *)&(this->m_buffers).m_objects,&local_30);
  }
LAB_00989a6a:
  setBufferBinding(this,target,buffer_00);
  return;
}

Assistant:

void ReferenceContext::bindBuffer (deUint32 target, deUint32 buffer)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);

	rc::DataBuffer*	bufObj	= DE_NULL;

	if (buffer != 0)
	{
		bufObj = m_buffers.find(buffer);
		if (!bufObj)
		{
			bufObj = new DataBuffer(buffer);
			m_buffers.insert(bufObj);
		}
	}

	setBufferBinding(target, bufObj);
}